

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

ctmbstr prvTidyEntityName(uint ch,uint versions)

{
  entity *local_20;
  entity *ep;
  ctmbstr entnam;
  uint versions_local;
  uint ch_local;
  
  local_20 = entities;
  while( true ) {
    if (local_20->name == (ctmbstr)0x0) {
      return (ctmbstr)0x0;
    }
    if ((local_20->code == ch) && ((local_20->versions & versions) != 0)) break;
    local_20 = local_20 + 1;
  }
  return local_20->name;
}

Assistant:

ctmbstr TY_(EntityName)( uint ch, uint versions )
{
    ctmbstr entnam = NULL;
    const entity *ep;

    for ( ep = entities; ep->name != NULL; ++ep )
    {
        if ( ep->code == ch )
        {
            if (ep->versions & versions)
            {
                entnam = ep->name;
                break; /* Issue #643 - Found code and version. Stop search? */
            }
        }
    }
    return entnam;
}